

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O3

void FAudio_INTERNAL_DecodeStereoMSADPCM
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FAudioWaveFormatEx *pFVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  byte *local_1058;
  int local_1030;
  undefined8 local_1008;
  undefined2 auStack_1000 [2024];
  
  if (samples != 0) {
    pFVar9 = (voice->field_19).src.format;
    uVar14 = (voice->field_19).src.curBufferOffset;
    uVar17 = (uint)pFVar9[1].wFormatTag;
    uVar20 = (ulong)uVar14 % (ulong)uVar17;
    uVar15 = 0;
    local_1058 = buffer->pAudioData + (uint)pFVar9->nBlockAlign * (uVar14 / uVar17);
    do {
      uVar14 = uVar17 - (int)uVar20;
      if (samples - uVar15 < uVar14) {
        uVar14 = samples - uVar15;
      }
      uVar4 = ((voice->field_19).src.format)->nBlockAlign;
      pbVar1 = local_1058 + 0xe;
      bVar3 = *local_1058;
      pbVar2 = local_1058 + 1;
      uVar10 = (uint)*(ushort *)(local_1058 + 2);
      uVar19 = (uint)*(ushort *)(local_1058 + 4);
      uVar11 = *(ulong *)(local_1058 + 6);
      local_1008 = CONCAT44((int)uVar11,(int)(uVar11 >> 0x20));
      local_1058 = pbVar1;
      if (uVar4 != 0xe) {
        iVar5 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_1 + (ulong)bVar3 * 4);
        iVar6 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_2 + (ulong)bVar3 * 4);
        iVar7 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_1 + (ulong)*pbVar2 * 4);
        iVar8 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_2 + (ulong)*pbVar2 * 4);
        uVar23 = uVar11 >> 0x30;
        local_1030 = uVar4 - 0xe;
        lVar24 = 0;
        uVar13 = uVar11 >> 0x20 & 0xffff;
        uVar21 = uVar11 & 0xffffffff;
        uVar16 = (uint)(ushort)(uVar11 >> 0x10);
        do {
          uVar25 = (uint)(pbVar1[lVar24] >> 4);
          uVar11 = (ulong)(uVar25 - 0x10 & 0xff);
          if (-1 < (char)pbVar1[lVar24]) {
            uVar11 = (ulong)uVar25;
          }
          iVar12 = (short)uVar13 * iVar6 + (short)uVar21 * iVar5;
          iVar18 = iVar12 + 0xff;
          if (-1 < iVar12) {
            iVar18 = iVar12;
          }
          uVar22 = (int)(char)uVar11 * (int)(short)uVar10 + (iVar18 >> 8);
          if ((int)uVar22 < -0x7fff) {
            uVar22 = 0xffff8000;
          }
          if (0x7ffe < (int)uVar22) {
            uVar22 = 0x7fff;
          }
          uVar10 = (int)(short)uVar10 *
                   *(int *)(FAudio_INTERNAL_ParseNibble_AdaptionTable + (ulong)uVar25 * 4);
          uVar25 = uVar10 + 0xff;
          if (-1 < (int)uVar10) {
            uVar25 = uVar10;
          }
          uVar10 = uVar25 >> 8;
          if ((short)(uVar25 >> 8) < 0x11) {
            uVar10 = 0x10;
          }
          auStack_1000[lVar24 * 2] = (short)uVar22;
          uVar25 = pbVar1[lVar24] & 0xf;
          iVar12 = (short)uVar23 * iVar8 + (short)uVar16 * iVar7;
          iVar18 = iVar12 + 0xff;
          if (-1 < iVar12) {
            iVar18 = iVar12;
          }
          uVar26 = (int)(char)((char)(pbVar1[lVar24] << 4) >> 7 & 0xf0U | (byte)uVar25) *
                   (int)(short)uVar19 + (iVar18 >> 8);
          if ((int)uVar26 < -0x7fff) {
            uVar26 = 0xffff8000;
          }
          if (0x7ffe < (int)uVar26) {
            uVar26 = 0x7fff;
          }
          uVar19 = (int)(short)uVar19 *
                   *(int *)(FAudio_INTERNAL_ParseNibble_AdaptionTable + (ulong)uVar25 * 4);
          uVar25 = uVar19 + 0xff;
          if (-1 < (int)uVar19) {
            uVar25 = uVar19;
          }
          uVar23 = (ulong)uVar16;
          uVar19 = uVar25 >> 8;
          if ((short)(uVar25 >> 8) < 0x11) {
            uVar19 = 0x10;
          }
          auStack_1000[lVar24 * 2 + 1] = (short)uVar26;
          lVar24 = lVar24 + 1;
          uVar13 = uVar21;
          uVar21 = (ulong)uVar22;
          uVar16 = uVar26;
        } while (local_1030 != (int)lVar24);
        local_1058 = pbVar1 + lVar24;
      }
      (*FAudio_INTERNAL_Convert_S16_To_F32)
                ((int16_t *)((long)&local_1008 + (ulong)(uint)((int)uVar20 * 2) * 2),decodeCache,
                 uVar14 * 2);
      decodeCache = decodeCache + uVar14 * 2;
      uVar15 = uVar15 + uVar14;
      uVar20 = 0;
    } while (uVar15 < samples);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodeStereoMSADPCM(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	/* Loop variables */
	uint32_t copy, done = 0;

	/* Read pointers */
	uint8_t *buf;
	int32_t midOffset;

	/* PCM block cache */
	int16_t blockCache[2024]; /* Max block size */

	/* Align, block size */
	uint32_t bsize = ((FAudioADPCMWaveFormat*) voice->src.format)->wSamplesPerBlock;

	LOG_FUNC_ENTER(voice->audio)

	/* Where are we starting? */
	buf = (uint8_t*) buffer->pAudioData + (
		(voice->src.curBufferOffset / bsize) *
		voice->src.format->nBlockAlign
	);

	/* Are we starting in the middle? */
	midOffset = (voice->src.curBufferOffset % bsize);

	/* Read in each block directly to the decode cache */
	while (done < samples)
	{
		copy = FAudio_min(samples - done, bsize - midOffset);
		FAudio_INTERNAL_DecodeStereoMSADPCMBlock(
			&buf,
			blockCache,
			voice->src.format->nBlockAlign
		);
		FAudio_INTERNAL_Convert_S16_To_F32(
			blockCache + (midOffset * 2),
			decodeCache,
			copy * 2
		);
		decodeCache += copy * 2;
		done += copy;
		midOffset = 0;
	}
	LOG_FUNC_EXIT(voice->audio)
}